

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_set_options.c
# Opt level: O3

int archive_set_format_option(archive *_a,char *m,char *o,char *v)

{
  int iVar1;
  
  if (_a[1].sconv == (archive_string_conv *)0x0) {
    iVar1 = (uint)(m != (char *)0x0) * 4 + -0x19;
  }
  else {
    if ((m != (char *)0x0) && (iVar1 = strcmp(m,(char *)_a[1].sconv), iVar1 != 0)) {
      return -0x15;
    }
    if (_a[2].vtable != (archive_vtable_conflict *)0x0) {
      iVar1 = (*(code *)_a[2].vtable)(_a,o,v);
      return iVar1;
    }
    iVar1 = -0x14;
  }
  return iVar1;
}

Assistant:

static int
archive_set_format_option(struct archive *_a, const char *m, const char *o,
    const char *v)
{
	struct archive_read *a = (struct archive_read *)_a;
	struct archive_format_descriptor *format;
	size_t i;
	int r, rv = ARCHIVE_WARN, matched_modules = 0;

	for (i = 0; i < sizeof(a->formats)/sizeof(a->formats[0]); i++) {
		format = &a->formats[i];
		if (format == NULL || format->options == NULL ||
		    format->name == NULL)
			/* This format does not support option. */
			continue;
		if (m != NULL) {
			if (strcmp(format->name, m) != 0)
				continue;
			++matched_modules;
		}

		a->format = format;
		r = format->options(a, o, v);
		a->format = NULL;

		if (r == ARCHIVE_FATAL)
			return (ARCHIVE_FATAL);

		if (r == ARCHIVE_OK)
			rv = ARCHIVE_OK;
	}
	/* If the format name didn't match, return a special code for
	 * _archive_set_option[s]. */
	if (m != NULL && matched_modules == 0)
		return ARCHIVE_WARN - 1;
	return (rv);
}